

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void Executor::statement(treeNode *node)

{
  size_t in_RDX;
  treeNode *in_RSI;
  treeNode *node_local;
  
  switch((node->kind).stmtKind) {
  case ifStmt:
    ifStmt((Executor *)node,in_RSI);
    break;
  case doRpt:
    doStmt(node);
    break;
  case whileRpt:
    whileStmt((Executor *)node,in_RSI);
    break;
  case forRpt:
    forStmt(node);
    break;
  case assignStmt:
    assignStmt(node);
    break;
  case declareStmt:
    declareStmt(node);
    break;
  case continueStmt:
    _continue();
    break;
  case readStmt:
    read((int)node,in_RSI,in_RDX);
    break;
  case printStmt:
    print(node);
    break;
  case breakStmt:
    _break();
  }
  return;
}

Assistant:

void statement(treeNode* node)
    {
        switch(node->kind.stmtKind)
        {
            case StmtKind::ifStmt:ifStmt(node);break;
            case StmtKind::printStmt:print(node);break;
            case StmtKind::whileRpt:whileStmt(node);break;
            case StmtKind::doRpt:doStmt(node);break;
            case StmtKind::forRpt:forStmt(node);break;
            case StmtKind::continueStmt:_continue();break;
            case StmtKind::assignStmt:assignStmt(node);break;
            case StmtKind::declareStmt:declareStmt(node);break;
            case StmtKind::readStmt:read(node);break;
            case StmtKind::breakStmt:_break();break;
        }
    }